

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

uint32 * rw::ps2::instanceXYZW(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  uint16 *puVar3;
  int8 *piVar4;
  ulong uVar5;
  float32 fVar6;
  
  pVVar2 = g->morphTargets->vertices;
  piVar4 = getADCbitsForMesh(g,m);
  if (idx < n + idx) {
    puVar3 = m->indices;
    uVar5 = (ulong)idx;
    do {
      uVar1 = puVar3[uVar5];
      *p = (uint32)pVVar2[uVar1].x;
      ((float32 *)p)[1] = pVVar2[uVar1].y;
      ((float32 *)p)[2] = pVVar2[uVar1].z;
      fVar6 = 0.0;
      if (piVar4 != (int8 *)0x0) {
        fVar6 = (float32)((uint)(piVar4[uVar5] != '\0') << 0xf);
      }
      ((float32 *)p)[3] = fVar6;
      p = (uint32 *)((float32 *)p + 4);
      uVar5 = uVar5 + 1;
    } while (n + idx != uVar5);
  }
  return (uint32 *)(float32 *)p;
}

Assistant:

uint32*
instanceXYZW(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->morphTargets[0].vertices;
	int8 *adcbits = getADCbitsForMesh(g, m);
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		*p++ = d[j*3+0];
		*p++ = d[j*3+1];
		*p++ = d[j*3+2];
		*p++ = adcbits && adcbits[i] ? 0x8000 : 0;
	}
	// don't need to pad
	return p;
}